

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

int apply_pan_envelope(IT_PLAYING *playing)

{
  uchar uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar2 = playing->pan;
  if (0x4000 < uVar2) {
    return (uint)uVar2;
  }
  uVar3 = (uint)uVar2;
  if (playing->panbrello_depth == 0) goto LAB_0057fa48;
  uVar1 = playing->panbrello_waveform;
  if (uVar1 == '\x01') {
    uVar6 = (ulong)playing->panbrello_time;
    pcVar5 = 
    "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
    ;
LAB_0057fa2a:
    pcVar5 = pcVar5 + uVar6;
  }
  else {
    if (uVar1 == '\x02') {
      uVar6 = (ulong)playing->panbrello_time;
      pcVar5 = 
      "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
      ;
      goto LAB_0057fa2a;
    }
    if (uVar1 != '\x03') {
      uVar6 = (ulong)playing->panbrello_time;
      pcVar5 = "";
      goto LAB_0057fa2a;
    }
    pcVar5 = &playing->panbrello_random;
  }
  uVar4 = (uint)playing->panbrello_depth * (int)*pcVar5 * 8 + (uint)uVar2;
  if ((int)uVar4 < 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0x4000;
    if (uVar4 < 0x4000) {
      uVar3 = uVar4;
    }
  }
LAB_0057fa48:
  if ((playing->env_instrument != (IT_INSTRUMENT *)0x0) && ((playing->enabled_envelopes & 2) != 0))
  {
    uVar4 = 0x4000 - uVar3;
    if (uVar3 < 0x2001) {
      uVar4 = uVar3;
    }
    uVar3 = uVar3 + ((int)(uVar4 * (playing->pan_envelope).value) >> 0xd);
  }
  return uVar3;
}

Assistant:

static int apply_pan_envelope(IT_PLAYING *playing)
{
	if (playing->pan <= 64 << IT_ENVELOPE_SHIFT) {
		int pan;
		if (playing->panbrello_depth) {
			switch (playing->panbrello_waveform) {
			default:
				pan = it_sine[playing->panbrello_time];
				break;
			case 1:
				pan = it_sawtooth[playing->panbrello_time];
				break;
			case 2:
				pan = it_squarewave[playing->panbrello_time];
				break;
			case 3:
				pan = playing->panbrello_random;
				break;
			}
			pan *= playing->panbrello_depth << 3;

			pan += playing->pan;
			if (pan < 0) pan = 0;
			else if (pan > 64 << IT_ENVELOPE_SHIFT) pan = 64 << IT_ENVELOPE_SHIFT;
		} else {
			pan = playing->pan;
		}

		if (playing->env_instrument && (playing->enabled_envelopes & IT_ENV_PANNING)) {
			int p = envelope_get_y(&playing->env_instrument->pan_envelope, &playing->pan_envelope);
			if (pan > 32 << IT_ENVELOPE_SHIFT)
				p *= (64 << IT_ENVELOPE_SHIFT) - pan;
			else
				p *= pan;
			pan += p >> (5 + IT_ENVELOPE_SHIFT);
		}
		return pan;
	}
	return playing->pan;
}